

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall spv::Builder::createCooperativeMatrixConversion(Builder *this,Id typeId,Id source)

{
  Id IVar1;
  Instruction *this_00;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_28;
  pointer local_20;
  Instruction *op;
  Id source_local;
  Id typeId_local;
  Builder *this_local;
  
  op._0_4_ = source;
  op._4_4_ = typeId;
  _source_local = this;
  this_00 = (Instruction *)::operator_new(0x60);
  IVar1 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar1,op._4_4_,OpCooperativeMatrixConvertNV);
  local_20 = this_00;
  spv::Instruction::addIdOperand(this_00,(Id)op);
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_28,
             local_20);
  addInstruction(this,&local_28);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_28);
  IVar1 = spv::Instruction::getResultId(local_20);
  return IVar1;
}

Assistant:

Id Builder::createCooperativeMatrixConversion(Id typeId, Id source)
{
    Instruction* op = new Instruction(getUniqueId(), typeId, OpCooperativeMatrixConvertNV);
    op->addIdOperand(source);
    addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}